

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Mesh * __thiscall SceneParser::parseTriangleMesh(SceneParser *this)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  Mesh *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char token [100];
  char filename [100];
  string local_118;
  short local_f8;
  undefined6 uStack_f6;
  char local_f0;
  char acStack_8c [4];
  char local_88 [112];
  
  getToken(this,(char *)&local_f8);
  if (local_f8 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a4,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,(char *)&local_f8);
  if (local_f0 != '\0' || CONCAT62(uStack_f6,local_f8) != 0x656c69665f6a626f) {
    __assert_fail("!strcmp(token, \"obj_file\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a6,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,local_88);
  getToken(this,(char *)&local_f8);
  if (local_f8 != 0x7d) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a9,"Mesh *SceneParser::parseTriangleMesh()");
  }
  sVar3 = strlen(local_88);
  iVar2 = strcmp(acStack_8c + sVar3,".obj");
  if (iVar2 == 0) {
    this_00 = (Mesh *)operator_new(0xe8);
    pcVar1 = (this->_basepath)._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + (this->_basepath)._M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    Mesh::Mesh(this_00,&local_118,this->_current_material);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    return this_00;
  }
  __assert_fail("!strcmp(ext, \".obj\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x1ab,"Mesh *SceneParser::parseTriangleMesh()");
}

Assistant:

Mesh *
SceneParser::parseTriangleMesh() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    char filename[MAX_PARSER_TOKEN_LENGTH];
    // get the filename
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "obj_file"));
    getToken(filename);
    getToken(token);
    assert(!strcmp(token, "}"));
    const char *ext = &filename[strlen(filename) - 4];
    assert(!strcmp(ext, ".obj"));
    Mesh *answer = new Mesh(_basepath + filename, _current_material);

    return answer;
}